

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<cmCMakePresetsGraph::PackagePreset> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>
::
Bind<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>>
          (Object<cmCMakePresetsGraph::PackagePreset> *this,string_view *name,
          Object<cmCMakePresetsGraph::PackagePreset> *func,bool required)

{
  Object<cmCMakePresetsGraph::PackagePreset> *pOVar1;
  MemberFunction local_48;
  byte local_21;
  Object<cmCMakePresetsGraph::PackagePreset> *pOStack_20;
  bool required_local;
  Object<cmCMakePresetsGraph::PackagePreset> *func_local;
  string_view *name_local;
  Object<cmCMakePresetsGraph::PackagePreset> *this_local;
  
  local_21 = required;
  pOStack_20 = func;
  func_local = (Object<cmCMakePresetsGraph::PackagePreset> *)name;
  name_local = (string_view *)this;
  std::
  function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::PackagePreset&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>&,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::PackagePreset&,Json::Value_const*)>
              *)&local_48,func);
  pOVar1 = BindPrivate(this,name,&local_48,(bool)(local_21 & 1));
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::PackagePreset_&,_const_Json::Value_*)>
  ::~function(&local_48);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, F func, bool required = true)
    {
      return this->BindPrivate(name, MemberFunction(func), required);
    }